

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-math.h
# Opt level: O1

RunResult wabt::interp::IntRem<unsigned_long>
                    (unsigned_long lhs,unsigned_long rhs,unsigned_long *out,string *out_msg)

{
  RunResult RVar1;
  
  if (rhs == 0) {
    std::__cxx11::string::operator=((string *)out_msg,"integer divide by zero");
    RVar1 = Trap;
  }
  else {
    RVar1 = Ok;
    *out = lhs % rhs;
  }
  return RVar1;
}

Assistant:

RunResult WABT_VECTORCALL IntRem(T lhs, T rhs, T* out, std::string* out_msg) {
  if (WABT_UNLIKELY(rhs == 0)) {
    *out_msg = "integer divide by zero";
    return RunResult::Trap;
  }
  if (WABT_LIKELY(IsNormalDivRem(lhs, rhs))) {
    *out = lhs % rhs;
  } else {
    *out = 0;
  }
  return RunResult::Ok;
}